

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

lyd_node *
lyd_parse_(ly_ctx *ctx,lyd_node *rpc_act,char *data,LYD_FORMAT format,int options,
          lyd_node *data_tree,char *yang_data_name)

{
  LY_ERR *pLVar1;
  uint local_4c;
  ly_ctx *plStack_48;
  int xmlopt;
  lyd_node *result;
  lyxml_elem *xml;
  lyd_node *data_tree_local;
  int options_local;
  LYD_FORMAT format_local;
  char *data_local;
  lyd_node *rpc_act_local;
  ly_ctx *ctx_local;
  
  plStack_48 = (ly_ctx *)0x0;
  xml = (lyxml_elem *)data_tree;
  data_tree_local._0_4_ = options;
  data_tree_local._4_4_ = format;
  _options_local = data;
  data_local = (char *)rpc_act;
  rpc_act_local = (lyd_node *)ctx;
  if ((ctx == (ly_ctx *)0x0) || (data == (char *)0x0)) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_parse_");
    ctx_local = (ly_ctx *)0x0;
  }
  else {
    local_4c = (uint)((options & 0x1000U) == 0);
    pLVar1 = ly_errno_glob_address();
    *pLVar1 = LY_SUCCESS;
    if (data_tree_local._4_4_ == LYD_XML) {
      result = (lyd_node *)lyxml_parse_mem((ly_ctx *)rpc_act_local,_options_local,local_4c);
      pLVar1 = ly_errno_glob_address();
      if (*pLVar1 == LY_SUCCESS) {
        if (((uint)data_tree_local & 0x20) == 0) {
          if (((uint)data_tree_local & 0x50) == 0) {
            if (((uint)data_tree_local & 0x1000000) == 0) {
              plStack_48 = (ly_ctx *)
                           lyd_parse_xml((ly_ctx *)rpc_act_local,(lyxml_elem **)&result,
                                         (uint)data_tree_local);
            }
            else {
              plStack_48 = (ly_ctx *)
                           lyd_parse_xml((ly_ctx *)rpc_act_local,(lyxml_elem **)&result,
                                         (uint)data_tree_local,yang_data_name);
            }
          }
          else {
            plStack_48 = (ly_ctx *)
                         lyd_parse_xml((ly_ctx *)rpc_act_local,(lyxml_elem **)&result,
                                       (uint)data_tree_local,xml);
          }
        }
        else {
          plStack_48 = (ly_ctx *)
                       lyd_parse_xml((ly_ctx *)rpc_act_local,(lyxml_elem **)&result,
                                     (uint)data_tree_local,data_local,xml);
        }
        lyxml_free_withsiblings((ly_ctx *)rpc_act_local,(lyxml_elem *)result);
      }
    }
    else if (data_tree_local._4_4_ == LYD_JSON) {
      plStack_48 = (ly_ctx *)
                   lyd_parse_json((ly_ctx *)rpc_act_local,_options_local,(uint)data_tree_local,
                                  (lyd_node *)data_local,(lyd_node *)xml,yang_data_name);
    }
    else if (data_tree_local._4_4_ == LYD_LYB) {
      plStack_48 = (ly_ctx *)
                   lyd_parse_lyb((ly_ctx *)rpc_act_local,_options_local,(uint)data_tree_local,
                                 (lyd_node *)xml,yang_data_name,(int *)0x0);
    }
    pLVar1 = ly_errno_glob_address();
    if (*pLVar1 == LY_SUCCESS) {
      ctx_local = plStack_48;
    }
    else {
      lyd_free_withsiblings((lyd_node *)plStack_48);
      ctx_local = (ly_ctx *)0x0;
    }
  }
  return (lyd_node *)ctx_local;
}

Assistant:

static struct lyd_node *
lyd_parse_(struct ly_ctx *ctx, const struct lyd_node *rpc_act, const char *data, LYD_FORMAT format, int options,
           const struct lyd_node *data_tree, const char *yang_data_name)
{
    struct lyxml_elem *xml;
    struct lyd_node *result = NULL;
    int xmlopt = LYXML_PARSE_MULTIROOT;

    if (!ctx || !data) {
        LOGARG;
        return NULL;
    }

    if (options & LYD_OPT_NOSIBLINGS) {
        xmlopt = 0;
    }

    /* we must free all the errors, otherwise we are unable to properly check returned ly_errno :-/ */
    ly_errno = LY_SUCCESS;
    switch (format) {
    case LYD_XML:
        xml = lyxml_parse_mem(ctx, data, xmlopt);
        if (ly_errno) {
            break;
        }
        if (options & LYD_OPT_RPCREPLY) {
            result = lyd_parse_xml(ctx, &xml, options, rpc_act, data_tree);
        } else if (options & (LYD_OPT_RPC | LYD_OPT_NOTIF)) {
            result = lyd_parse_xml(ctx, &xml, options, data_tree);
        } else if (options & LYD_OPT_DATA_TEMPLATE) {
            result = lyd_parse_xml(ctx, &xml, options, yang_data_name);
        } else {
            result = lyd_parse_xml(ctx, &xml, options);
        }
        lyxml_free_withsiblings(ctx, xml);
        break;
    case LYD_JSON:
        result = lyd_parse_json(ctx, data, options, rpc_act, data_tree, yang_data_name);
        break;
    case LYD_LYB:
        result = lyd_parse_lyb(ctx, data, options, data_tree, yang_data_name, NULL);
        break;
    default:
        /* error */
        break;
    }

    if (ly_errno) {
        lyd_free_withsiblings(result);
        return NULL;
    } else {
        return result;
    }
}